

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixShmLock(sqlite3_file *fd,int ofst,int n,int flags)

{
  ushort *puVar1;
  int *piVar2;
  sqlite3_io_methods *psVar3;
  long lVar4;
  ushort uVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  long lVar9;
  ushort uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  
  psVar3 = fd[8].pMethods;
  if (psVar3 == (sqlite3_io_methods *)0x0) {
    return 0x140a;
  }
  lVar4 = *(long *)psVar3;
  if (lVar4 == 0) {
    return 0x140a;
  }
  iVar13 = n + ofst;
  bVar6 = true;
  uVar12 = 1 << ((byte)ofst & 0x1f);
  if (*(sqlite3_mutex **)(lVar4 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar4 + 8));
  }
  lVar11 = lVar4 + 0x40;
  uVar14 = (1 << ((byte)iVar13 & 0x1f)) - uVar12;
  uVar5 = (ushort)uVar14;
  if ((flags & 1U) == 0) {
    if ((flags & 4U) != 0) {
      uVar7 = *(ushort *)((long)&psVar3->xRead + 2);
      iVar8 = 0;
      if ((uVar14 & uVar7) == 0) {
        lVar9 = (long)ofst;
        iVar13 = *(int *)(lVar11 + lVar9 * 4);
        if (iVar13 < 0) {
          iVar8 = 5;
        }
        else {
          if (iVar13 == 0) {
            iVar8 = unixShmSystemLock((unixFile *)fd,0,ofst + 0x78,n);
            if (iVar8 != 0) goto LAB_00124dde;
            uVar7 = *(ushort *)((long)&psVar3->xRead + 2);
            iVar13 = *(int *)(lVar11 + lVar9 * 4);
          }
          *(ushort *)((long)&psVar3->xRead + 2) = uVar7 | uVar5;
          *(int *)(lVar11 + lVar9 * 4) = iVar13 + 1;
          iVar8 = 0;
        }
      }
      goto LAB_00124dde;
    }
    lVar15 = (long)ofst;
    for (lVar9 = lVar15; lVar9 < iVar13; lVar9 = lVar9 + 1) {
      if (((*(ushort *)((long)&psVar3->xRead + 4) >> ((uint)lVar9 & 0x1f) & 1) == 0) &&
         (iVar8 = 5, *(int *)(lVar11 + lVar9 * 4) != 0)) goto LAB_00124dde;
    }
    iVar8 = unixShmSystemLock((unixFile *)fd,1,ofst + 0x78,n);
    if (iVar8 != 0) goto LAB_00124dde;
    puVar1 = (ushort *)((long)&psVar3->xRead + 4);
    *puVar1 = *puVar1 | uVar5;
    for (; lVar15 < iVar13; lVar15 = lVar15 + 1) {
      *(undefined4 *)(lVar11 + lVar15 * 4) = 0xffffffff;
    }
  }
  else {
    uVar7 = *(ushort *)((long)&psVar3->xRead + 2);
    uVar10 = (ushort)*(undefined4 *)((long)&psVar3->xRead + 4);
    if (((uVar7 | uVar10) & uVar5) != 0) {
      lVar15 = (long)ofst;
      for (lVar9 = lVar15; lVar9 < iVar13; lVar9 = lVar9 + 1) {
        if ((int)(uint)((uVar7 >> ((uint)lVar9 & 0x1f) & 1) != 0) < *(int *)(lVar11 + lVar9 * 4)) {
          bVar6 = false;
        }
      }
      if (bVar6) {
        iVar8 = unixShmSystemLock((unixFile *)fd,2,ofst + 0x78,n);
        if (iVar8 != 0) goto LAB_00124dde;
        memset((void *)(lVar11 + lVar15 * 4),0,(long)n << 2);
        uVar7 = *(ushort *)((long)&psVar3->xRead + 2);
        uVar10 = *(ushort *)((long)&psVar3->xRead + 4);
      }
      else if ((uVar12 & uVar7) != 0) {
        piVar2 = (int *)(lVar11 + lVar15 * 4);
        *piVar2 = *piVar2 + -1;
      }
      *(ushort *)((long)&psVar3->xRead + 4) = uVar10 & ~uVar5;
      *(ushort *)((long)&psVar3->xRead + 2) = uVar7 & ~uVar5;
    }
  }
  iVar8 = 0;
LAB_00124dde:
  if (*(sqlite3_mutex **)(lVar4 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar4 + 8));
  }
  return iVar8;
}

Assistant:

static int unixShmLock(
  sqlite3_file *fd,          /* Database file holding the shared memory */
  int ofst,                  /* First lock to acquire or release */
  int n,                     /* Number of locks to acquire or release */
  int flags                  /* What to do with the lock */
){
  unixFile *pDbFd = (unixFile*)fd;      /* Connection holding shared memory */
  unixShm *p;                           /* The shared memory being locked */
  unixShmNode *pShmNode;                /* The underlying file iNode */
  int rc = SQLITE_OK;                   /* Result code */
  u16 mask;                             /* Mask of locks to take or release */
  int *aLock;

  p = pDbFd->pShm;
  if( p==0 ) return SQLITE_IOERR_SHMLOCK;
  pShmNode = p->pShmNode;
  if( NEVER(pShmNode==0) ) return SQLITE_IOERR_SHMLOCK;
  aLock = pShmNode->aLock;

  assert( pShmNode==pDbFd->pInode->pShmNode );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( ofst>=0 && ofst+n<=SQLITE_SHM_NLOCK );
  assert( n>=1 );
  assert( flags==(SQLITE_SHM_LOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_LOCK | SQLITE_SHM_EXCLUSIVE)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_EXCLUSIVE) );
  assert( n==1 || (flags & SQLITE_SHM_EXCLUSIVE)!=0 );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  /* Check that, if this to be a blocking lock, no locks that occur later
  ** in the following list than the lock being obtained are already held:
  **
  **   1. Checkpointer lock (ofst==1).
  **   2. Write lock (ofst==0).
  **   3. Read locks (ofst>=3 && ofst<SQLITE_SHM_NLOCK).
  **
  ** In other words, if this is a blocking lock, none of the locks that
  ** occur later in the above list than the lock being obtained may be
  ** held.
  **
  ** It is not permitted to block on the RECOVER lock.
  */
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  assert( (flags & SQLITE_SHM_UNLOCK) || pDbFd->iBusyTimeout==0 || (
         (ofst!=2)                                   /* not RECOVER */
      && (ofst!=1 || (p->exclMask|p->sharedMask)==0)
      && (ofst!=0 || (p->exclMask|p->sharedMask)<3)
      && (ofst<3  || (p->exclMask|p->sharedMask)<(1<<ofst))
  ));
#endif

  mask = (1<<(ofst+n)) - (1<<ofst);
  assert( n>1 || mask==(1<<ofst) );
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  assert( assertLockingArrayOk(pShmNode) );
  if( flags & SQLITE_SHM_UNLOCK ){
    if( (p->exclMask|p->sharedMask) & mask ){
      int ii;
      int bUnlock = 1;

      for(ii=ofst; ii<ofst+n; ii++){
        if( aLock[ii]>((p->sharedMask & (1<<ii)) ? 1 : 0) ){
          bUnlock = 0;
        }
      }

      if( bUnlock ){
        rc = unixShmSystemLock(pDbFd, F_UNLCK, ofst+UNIX_SHM_BASE, n);
        if( rc==SQLITE_OK ){
          memset(&aLock[ofst], 0, sizeof(int)*n);
        }
      }else if( ALWAYS(p->sharedMask & (1<<ofst)) ){
        assert( n==1 && aLock[ofst]>1 );
        aLock[ofst]--;
      }

      /* Undo the local locks */
      if( rc==SQLITE_OK ){
        p->exclMask &= ~mask;
        p->sharedMask &= ~mask;
      }
    }
  }else if( flags & SQLITE_SHM_SHARED ){
    assert( n==1 );
    assert( (p->exclMask & (1<<ofst))==0 );
    if( (p->sharedMask & mask)==0 ){
      if( aLock[ofst]<0 ){
        rc = SQLITE_BUSY;
      }else if( aLock[ofst]==0 ){
        rc = unixShmSystemLock(pDbFd, F_RDLCK, ofst+UNIX_SHM_BASE, n);
      }

      /* Get the local shared locks */
      if( rc==SQLITE_OK ){
        p->sharedMask |= mask;
        aLock[ofst]++;
      }
    }
  }else{
    /* Make sure no sibling connections hold locks that will block this
    ** lock.  If any do, return SQLITE_BUSY right away.  */
    int ii;
    for(ii=ofst; ii<ofst+n; ii++){
      assert( (p->sharedMask & mask)==0 );
      if( ALWAYS((p->exclMask & (1<<ii))==0) && aLock[ii] ){
        rc = SQLITE_BUSY;
        break;
      }
    }

    /* Get the exclusive locks at the system level. Then if successful
    ** also update the in-memory values. */
    if( rc==SQLITE_OK ){
      rc = unixShmSystemLock(pDbFd, F_WRLCK, ofst+UNIX_SHM_BASE, n);
      if( rc==SQLITE_OK ){
        assert( (p->sharedMask & mask)==0 );
        p->exclMask |= mask;
        for(ii=ofst; ii<ofst+n; ii++){
          aLock[ii] = -1;
        }
      }
    }
  }
  assert( assertLockingArrayOk(pShmNode) );
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  OSTRACE(("SHM-LOCK shmid-%d, pid-%d got %03x,%03x\n",
           p->id, osGetpid(0), p->sharedMask, p->exclMask));
  return rc;
}